

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::IDataBlob> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IDataBlob>::operator=
          (RefCntAutoPtr<Diligent::IDataBlob> *this,RefCntAutoPtr<Diligent::DataBlobImpl> *AutoPtr)

{
  DataBlobImpl *pDVar1;
  DataBlobImpl *pObj;
  
  pDVar1 = AutoPtr->m_pObject;
  if ((DataBlobImpl *)this->m_pObject != pDVar1) {
    AutoPtr->m_pObject = (DataBlobImpl *)0x0;
    Release(this);
    this->m_pObject = (IDataBlob *)pDVar1;
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(RefCntAutoPtr<DerivedType>&& AutoPtr) noexcept
    {
        if (m_pObject != AutoPtr.m_pObject)
            Attach(AutoPtr.Detach());

        return *this;
    }